

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CollectFieldsTest_RepeatedAndSingular_Test::
TestBody(CollectFieldsTest_RepeatedAndSingular_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  reference ppFVar4;
  size_type in_RCX;
  anon_class_1_0_00000001 *in_R8;
  char *in_R9;
  Span<const_char_*> field_names_00;
  string local_278;
  AssertHelper local_258;
  Message local_250;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__1;
  Message local_228;
  int local_21c;
  size_type local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  Message local_1b0;
  int local_1a4;
  size_type local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_180;
  Message local_178;
  int local_16c;
  size_type local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  Options local_140;
  undefined1 local_68 [8];
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  chunks;
  pointer local_48;
  undefined1 local_40 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  char *field_names [3];
  CollectFieldsTest_RepeatedAndSingular_Test *this_local;
  
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1eba9d4;
  absl::lts_20250127::Span<char_const*>::Span<3ul>
            ((Span<char_const*> *)
             &chunks.
              super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (char *(*) [3])
             &fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  field_names_00.len_ = in_RCX;
  field_names_00.ptr_ = local_48;
  CreateFieldArray<proto2_unittest::TestAllTypes>
            ((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_40,
             (anon_unknown_0 *)
             chunks.
             super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,field_names_00);
  local_140.access_info_map = (AccessInfoMap *)0x0;
  local_140.split_map = (SplitMap *)0x0;
  std::__cxx11::string::string((string *)&local_140.dllexport_decl);
  std::__cxx11::string::string((string *)&local_140.runtime_include_base);
  std::__cxx11::string::string((string *)&local_140.annotation_pragma_name);
  std::__cxx11::string::string((string *)&local_140.annotation_guard_name);
  local_140.field_listener_options.inject_field_listener_events = false;
  absl::lts_20250127::
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flat_hash_set(&local_140.field_listener_options.forbidden_field_listener_events);
  local_140.enforce_mode = kNoEnforcement;
  local_140.num_cc_files = 0;
  local_140.bounds_check_mode = kNoEnforcement;
  local_140.proto_h = false;
  local_140.transitive_pb_h = true;
  local_140.annotate_headers = false;
  local_140.lite_implicit_weak_fields = false;
  local_140.descriptor_implicit_weak_messages = false;
  local_140.bootstrap = false;
  local_140.opensource_runtime = false;
  local_140.annotate_accessor = false;
  local_140.force_split = false;
  local_140.force_eagerly_verified_lazy = false;
  local_140.force_inline_string = false;
  local_140.strip_nonfunctional_codegen = false;
  local_140.experimental_use_micro_string = protobuf::internal::EnableExperimentalMicroString();
  CollectFields<google::protobuf::compiler::cpp::(anonymous_namespace)::CollectFieldsTest_RepeatedAndSingular_Test::TestBody()::__0>
            ((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
              *)local_68,(cpp *)local_40,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&local_140,
             (Options *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 3),in_R8);
  Options::~Options(&local_140);
  local_168 = std::
              vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
              ::size((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                      *)local_68);
  local_16c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_160,"chunks.size()","2",&local_168,&local_16c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pvVar3 = std::
             vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
             ::operator[]((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                           *)local_68,0);
    local_1a0 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(&pvVar3->fields);
    local_1a4 = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_198,"chunks[0].fields.size()","1",&local_1a0,&local_1a4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
                 ,0x4f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
    pvVar3 = std::
             vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
             ::operator[]((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                           *)local_68,0);
    ppFVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::front(&pvVar3->fields);
    local_1c9 = FieldDescriptor::is_repeated(*ppFVar4);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_1c8,
                 (AssertionResult *)"chunks[0].fields.front()->is_repeated()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
                 ,0x50,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e0);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
    pvVar3 = std::
             vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
             ::operator[]((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                           *)local_68,1);
    local_218 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(&pvVar3->fields);
    local_21c = 2;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_210,"chunks[1].fields.size()","2",&local_218,&local_21c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_228);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
                 ,0x52,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_228);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_228);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    pvVar3 = std::
             vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
             ::operator[]((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                           *)local_68,1);
    ppFVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::front(&pvVar3->fields);
    bVar1 = FieldDescriptor::is_repeated(*ppFVar4);
    local_241 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_240,&local_241,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_278,(internal *)local_240,
                 (AssertionResult *)"chunks[1].fields.front()->is_repeated()","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
                 ,0x53,pcVar2);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  std::
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ::~vector((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
             *)local_68);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_40);
  return;
}

Assistant:

TEST(CollectFieldsTest, RepeatedAndSingular) {
  const char* field_names[] = {"repeated_int32", "optional_int32",
                               "optional_int64"};

  auto fields = CreateFieldArray<TestAllTypes>(field_names);
  auto chunks = CollectFields(
      fields, {}, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return lhs->is_repeated() == rhs->is_repeated();
      });

  ASSERT_EQ(chunks.size(), 2);

  EXPECT_EQ(chunks[0].fields.size(), 1);
  EXPECT_TRUE(chunks[0].fields.front()->is_repeated());

  EXPECT_EQ(chunks[1].fields.size(), 2);
  EXPECT_FALSE(chunks[1].fields.front()->is_repeated());
}